

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Storage * createStorage(void)

{
  ostream *poVar1;
  int iVar2;
  Storage *in_RDI;
  bool bVar3;
  int size;
  string local_80;
  string storageName;
  string local_40;
  
  storageName._M_dataplus._M_p = (pointer)&storageName.field_2;
  storageName._M_string_length = 0;
  storageName.field_2._M_local_buf[0] = '\0';
  iVar2 = 0x12;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    std::operator<<((ostream *)&std::cout,"====");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Storage Name(\'r\' for random name):");
  std::operator>>((istream *)&std::cin,(string *)&storageName);
  poVar1 = std::operator<<((ostream *)&std::cout,"How many bytes ");
  poVar1 = std::operator<<(poVar1,(string *)&storageName);
  std::operator<<(poVar1," have?");
  std::istream::operator>>((istream *)&std::cin,&size);
  bVar3 = std::operator==(&storageName,"r");
  if (bVar3) {
    Storage::Storage(in_RDI,size);
    Storage::print(in_RDI);
    Storage::name_abi_cxx11_(&local_80,in_RDI);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_80);
    poVar1 = std::operator<<(poVar1," created successfully.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_80);
    iVar2 = 0x12;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      std::operator<<((ostream *)&std::cout,"====");
    }
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)&storageName);
    Storage::Storage(in_RDI,&local_40,size);
    std::__cxx11::string::~string((string *)&local_40);
    Storage::print(in_RDI);
    Storage::name_abi_cxx11_(&local_80,in_RDI);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_80);
    poVar1 = std::operator<<(poVar1," created successfully.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_80);
    iVar2 = 0x12;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      std::operator<<((ostream *)&std::cout,"====");
    }
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::string::~string((string *)&storageName);
  return in_RDI;
}

Assistant:

Storage createStorage() {
    string storageName;
    int size;

    for (int i = 0; i < (BITCOUNT + 1) * 2; ++i) {
        cout<<"====";
    }
    cout<<endl;

    cout<<"Storage Name('r' for random name):";
    cin>>storageName;
    cout<<"How many bytes "<<storageName<<" have?";
    cin>>size;

    if (storageName=="r") {
        Storage storage1(size);
        storage1.print();
        cout << storage1.name() << " created successfully." << endl;
        for (int i = 0; i < (BITCOUNT + 1) * 2; ++i) {
            cout<<"====";
        }
        cout<<endl<<endl;

        return storage1;
    } else {
        Storage storage1(storageName, size);
        storage1.print();
        cout << storage1.name() << " created successfully." << endl;
        for (int i = 0; i < (BITCOUNT + 1) * 2; ++i) {
            cout << "====";
        }
        cout << endl<<endl;

        return storage1;
    }
}